

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O0

int TeleportGetParameter(int stream,int index,float *value)

{
  int iVar1;
  SharedMemoryHandle *this;
  SharedMemory *pSVar2;
  int changed;
  Stream *s;
  float *value_local;
  int index_local;
  int stream_local;
  
  this = Teleport::GetSharedMemory();
  pSVar2 = Teleport::SharedMemoryHandle::operator->(this);
  *value = pSVar2->streams[stream].params[index].value;
  iVar1 = pSVar2->streams[stream].params[index].changed;
  pSVar2->streams[stream].params[index].changed = 0;
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int TeleportGetParameter(int stream, int index, float* value)
{
    Teleport::Stream& s = Teleport::GetSharedMemory()->streams[stream];
    *value = s.params[index].value;
    int changed = s.params[index].changed;
    s.params[index].changed = 0;
    return changed;
}